

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser * init_parse_shape(void)

{
  parser *p;
  
  p = parser_new();
  z_info->shape_max = 0;
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_shape_name);
  parser_reg(p,"combat int to-h int to-d int to-a",parse_shape_combat);
  parser_reg(p,"skill-disarm-phys int disarm",parse_shape_skill_disarm_phys);
  parser_reg(p,"skill-disarm-magic int disarm",parse_shape_skill_disarm_magic);
  parser_reg(p,"skill-save int save",parse_shape_skill_save);
  parser_reg(p,"skill-stealth int stealth",parse_shape_skill_stealth);
  parser_reg(p,"skill-search int search",parse_shape_skill_search);
  parser_reg(p,"skill-melee int melee",parse_shape_skill_melee);
  parser_reg(p,"skill-throw int throw",parse_shape_skill_throw);
  parser_reg(p,"skill-dig int dig",parse_shape_skill_dig);
  parser_reg(p,"obj-flags ?str flags",parse_shape_obj_flags);
  parser_reg(p,"player-flags ?str flags",parse_shape_play_flags);
  parser_reg(p,"values str values",parse_shape_values);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_shape_effect);
  parser_reg(p,"effect-yx int y int x",parse_shape_effect_yx);
  parser_reg(p,"dice str dice",parse_shape_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_shape_expr);
  parser_reg(p,"effect-msg str text",parse_shape_effect_msg);
  parser_reg(p,"blow str blow",parse_shape_blow);
  return p;
}

Assistant:

static struct parser *init_parse_shape(void) {
	struct parser *p = parser_new();
	z_info->shape_max = 0;
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_shape_name);
	parser_reg(p, "combat int to-h int to-d int to-a", parse_shape_combat);
	parser_reg(p, "skill-disarm-phys int disarm", parse_shape_skill_disarm_phys);
	parser_reg(p, "skill-disarm-magic int disarm", parse_shape_skill_disarm_magic);
	parser_reg(p, "skill-save int save", parse_shape_skill_save);
	parser_reg(p, "skill-stealth int stealth", parse_shape_skill_stealth);
	parser_reg(p, "skill-search int search", parse_shape_skill_search);
	parser_reg(p, "skill-melee int melee", parse_shape_skill_melee);
	parser_reg(p, "skill-throw int throw", parse_shape_skill_throw);
	parser_reg(p, "skill-dig int dig", parse_shape_skill_dig);
	parser_reg(p, "obj-flags ?str flags", parse_shape_obj_flags);
	parser_reg(p, "player-flags ?str flags", parse_shape_play_flags);
	parser_reg(p, "values str values", parse_shape_values);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_shape_effect);
	parser_reg(p, "effect-yx int y int x", parse_shape_effect_yx);
	parser_reg(p, "dice str dice", parse_shape_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_shape_expr);
	parser_reg(p, "effect-msg str text", parse_shape_effect_msg);
	parser_reg(p, "blow str blow", parse_shape_blow);
	return p;
}